

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O1

ps_config_t * ps_config_parse_json(ps_config_t *config,char *json)

{
  jsmntype_t jVar1;
  uint num_tokens;
  uint err;
  ps_config_t *config_00;
  size_t sVar2;
  jsmntok_t *tokens;
  char *out;
  char *out_00;
  anytype_t *paVar3;
  char *fmt;
  long ln;
  int *piVar4;
  ulong uVar5;
  jsmn_parser parser;
  jsmn_parser local_3c;
  
  if (json != (char *)0x0) {
    config_00 = config;
    if ((config == (ps_config_t *)0x0) &&
       (config_00 = ps_config_init((ps_arg_t *)0x0), config_00 == (ps_config_t *)0x0)) {
      return (ps_config_t *)0x0;
    }
    local_3c.pos = 0;
    local_3c.toknext = 0;
    local_3c.toksuper = -1;
    sVar2 = strlen(json);
    num_tokens = jsmn_parse(&local_3c,json,(long)(int)sVar2,(jsmntok_t *)0x0,0);
    if ((int)num_tokens < 1) {
      json_error(num_tokens);
      tokens = (jsmntok_t *)0x0;
    }
    else {
      local_3c.pos = 0;
      local_3c.toknext = 0;
      local_3c.toksuper = -1;
      tokens = (jsmntok_t *)
               __ckd_calloc__((ulong)num_tokens,0x10,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                              ,0xf2);
      err = jsmn_parse(&local_3c,json,(long)(int)sVar2,tokens,num_tokens);
      if (err == num_tokens) {
        jVar1 = tokens->type;
        if ((int)(uint)(jVar1 == JSMN_OBJECT) < (int)num_tokens) {
          uVar5 = (ulong)(jVar1 == JSMN_OBJECT);
          piVar4 = &tokens[(ulong)(jVar1 == JSMN_OBJECT) + 1].end;
          do {
            out = (char *)__ckd_malloc__((long)((piVar4[-4] - piVar4[-5]) + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                         ,0xfc);
            unescape(out,json + piVar4[-5],(long)piVar4[-4] - (long)piVar4[-5]);
            if ((piVar4[-6] != 4) && (piVar4[-6] != 8)) {
              fmt = "Expected string or primitive key, got %s\n";
              out_00 = (char *)0x0;
              ln = 0xff;
LAB_00107848:
              err_msg(ERR_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                      ,ln,fmt,out);
              goto LAB_001077bb;
            }
            if ((ulong)num_tokens - 1 == uVar5) {
              fmt = "Missing value for %s\n";
              out_00 = (char *)0x0;
              ln = 0x103;
              goto LAB_00107848;
            }
            out_00 = (char *)__ckd_malloc__((long)((*piVar4 - piVar4[-1]) + 1),
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                            ,0x106);
            unescape(out_00,json + piVar4[-1],(long)*piVar4 - (long)piVar4[-1]);
            paVar3 = ps_config_set_str(config_00,out,out_00);
            if (paVar3 == (anytype_t *)0x0) {
              fmt = "Unknown or invalid parameter %s\n";
              ln = 0x109;
              goto LAB_00107848;
            }
            ckd_free(out);
            ckd_free(out_00);
            uVar5 = uVar5 + 2;
            piVar4 = piVar4 + 8;
          } while ((int)uVar5 < (int)num_tokens);
        }
        ckd_free((void *)0x0);
        ckd_free((void *)0x0);
        ckd_free(tokens);
        return config_00;
      }
      json_error(err);
    }
    out = (char *)0x0;
    out_00 = (char *)0x0;
LAB_001077bb:
    if (out != (char *)0x0) {
      ckd_free(out);
    }
    if (out_00 != (char *)0x0) {
      ckd_free(out_00);
    }
    if (tokens != (jsmntok_t *)0x0) {
      ckd_free(tokens);
    }
    if (config == (ps_config_t *)0x0) {
      ps_config_free(config_00);
    }
  }
  return (ps_config_t *)0x0;
}

Assistant:

ps_config_t *
ps_config_parse_json(ps_config_t *config,
                     const char *json)
{
    jsmn_parser parser;
    jsmntok_t *tokens = NULL;
    char *key = NULL, *val = NULL;
    int i, jslen, ntok, new_config = FALSE;

    if (json == NULL)
        return NULL;
    if (config == NULL) {
        if ((config = ps_config_init(NULL)) == NULL)
            return NULL;
        new_config = TRUE;
    }
    jsmn_init(&parser);
    jslen = strlen(json);
    if ((ntok = jsmn_parse(&parser, json, jslen, NULL, 0)) <= 0) {
        json_error(ntok);
        goto error_out;
    }
    /* Need to reset the parser before second pass! */
    jsmn_init(&parser);
    tokens = ckd_calloc(ntok, sizeof(*tokens));
    if ((i = jsmn_parse(&parser, json, jslen, tokens, ntok)) != ntok) {
        json_error(i);
        goto error_out;
    }
    /* Accept missing top-level object. */
    i = 0;
    if (tokens[0].type == JSMN_OBJECT)
        ++i;
    while (i < ntok) {
        key = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(key, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (tokens[i].type != JSMN_STRING && tokens[i].type != JSMN_PRIMITIVE) {
            E_ERROR("Expected string or primitive key, got %s\n", key);
            goto error_out;
        }
        if (++i == ntok) {
            E_ERROR("Missing value for %s\n", key);
            goto error_out;
        }
        val = ckd_malloc(tokens[i].end - tokens[i].start + 1);
        unescape(val, json + tokens[i].start, tokens[i].end - tokens[i].start);
        if (ps_config_set_str(config, key, val) == NULL) {
            E_ERROR("Unknown or invalid parameter %s\n", key);
            goto error_out;
        }
        ckd_free(key);
        ckd_free(val);
        key = val = NULL;
        ++i;
    }

    ckd_free(key);
    ckd_free(val);
    ckd_free(tokens);
    return config;

error_out:
    if (key)
        ckd_free(key);
    if (val)
        ckd_free(val);
    if (tokens)
        ckd_free(tokens);
    if (new_config)
        ps_config_free(config);
    return NULL;
}